

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O2

hrgls_Status __thiscall hrgls::API::SetVerbosity(API *this,uint16_t verbosity)

{
  ostream *poVar1;
  hrgls_Status hVar2;
  
  if (this->m_private == (API_private *)0x0) {
    hVar2 = 0x3ee;
  }
  else {
    this->m_private->verbosity = verbosity;
    hVar2 = 0;
    if (200 < verbosity) {
      poVar1 = std::operator<<((ostream *)&std::cout,"API::SetVerbosity(): New verbosity: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,verbosity);
      std::endl<char,std::char_traits<char>>(poVar1);
      hVar2 = 0;
    }
  }
  return hVar2;
}

Assistant:

hrgls_Status API::SetVerbosity(uint16_t verbosity)
  {
    if (!m_private) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    m_private->verbosity = verbosity;
    if (m_private->verbosity > 200) {
      std::cout << "API::SetVerbosity(): New verbosity: " << verbosity << std::endl;
    }
    return hrgls_STATUS_OKAY;
  }